

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint64_t hash_fmix_64(uint64_t k)

{
  ulong uVar1;
  
  uVar1 = (k >> 0x21 ^ k) * -0xae502812aa7333;
  uVar1 = (uVar1 >> 0x21 ^ uVar1) * -0x3b314601e57a13ad;
  return uVar1 >> 0x21 ^ uVar1;
}

Assistant:

static inline uint64_t
hash_fmix_64(uint64_t k) {
	k ^= k >> 33;
	k *= KQU(0xff51afd7ed558ccd);
	k ^= k >> 33;
	k *= KQU(0xc4ceb9fe1a85ec53);
	k ^= k >> 33;

	return k;
}